

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

void __thiscall
actorpp::ActorThread<actorpp::RecvThread>::~ActorThread(ActorThread<actorpp::RecvThread> *this)

{
  int in_ESI;
  ActorThread<actorpp::RecvThread> *this_local;
  
  RecvThread::exit(&this->super_RecvThread,in_ESI);
  std::thread::join();
  std::thread::~thread(&this->thread);
  RecvThread::~RecvThread(&this->super_RecvThread);
  return;
}

Assistant:

~ActorThread() {
    this->exit();
    thread.join();
  }